

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::add_extension_fun
          (torrent *this,
          function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
          *ext,client_data_t userdata)

{
  bool bVar1;
  client_data_t __args_1;
  shared_ptr<libtorrent::torrent_plugin> local_78;
  uint local_68;
  char *local_58;
  void *pvStack_50;
  undefined1 local_48 [16];
  shared_ptr<libtorrent::torrent_plugin> tp;
  function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
  *ext_local;
  torrent *this_local;
  client_data_t userdata_local;
  
  tp.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ext;
  get_handle((torrent *)local_48);
  __args_1.m_client_ptr = userdata.m_type_ptr;
  __args_1.m_type_ptr = (char *)local_48;
  local_58 = userdata.m_type_ptr;
  pvStack_50 = userdata.m_client_ptr;
  ::std::
  function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
  ::operator()((function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
                *)&stack0xffffffffffffffc8,(torrent_handle *)ext,__args_1);
  torrent_handle::~torrent_handle((torrent_handle *)local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc8);
  if (bVar1) {
    ::std::shared_ptr<libtorrent::torrent_plugin>::shared_ptr
              (&local_78,(shared_ptr<libtorrent::torrent_plugin> *)&stack0xffffffffffffffc8);
    add_extension(this,&local_78);
    ::std::shared_ptr<libtorrent::torrent_plugin>::~shared_ptr(&local_78);
  }
  local_68 = (uint)!bVar1;
  ::std::shared_ptr<libtorrent::torrent_plugin>::~shared_ptr
            ((shared_ptr<libtorrent::torrent_plugin> *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void torrent::add_extension_fun(std::function<std::shared_ptr<torrent_plugin>(torrent_handle const&, client_data_t)> const& ext
		, client_data_t userdata)
	{
		std::shared_ptr<torrent_plugin> tp(ext(get_handle(), userdata));
		if (!tp) return;

		add_extension(tp);
	}